

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateVkImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateVkImpl::InitializePipeline
          (PipelineStateVkImpl *this,RayTracingPipelineStateCreateInfo *CreateInfo)

{
  VulkanLogicalDevice *this_00;
  GraphicsPipelineData *pGVar1;
  RayTracingGeneralShaderGroup *pRVar2;
  RayTracingTriangleHitShaderGroup *pRVar3;
  RayTracingProceduralHitShaderGroup *pRVar4;
  IPipelineStateCache *pSrcPtr;
  uint uVar5;
  VkResult VVar6;
  const_iterator cVar7;
  ulong uVar8;
  size_type sVar9;
  VkPipelineCache cache;
  Uint32 i_1;
  char (*Args) [28];
  char (*Args_00) [34];
  Uint32 i;
  ulong uVar10;
  RayTracingPipelineData *pRVar11;
  long lVar12;
  Uint32 i_2;
  BLEND_FACTOR *this_01;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  *ShaderModules_00;
  char (*Args_01) [32];
  char (*in_stack_fffffffffffffe98) [143];
  anon_class_8_1_b52c7398 GetShaderModuleIndex;
  vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  vkShaderGroups;
  ulong local_138;
  string msg;
  VkRayTracingShaderGroupCreateInfoKHR Group;
  vector<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  vkShaderStages;
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ShaderModules;
  TShaderStages ShaderStages;
  
  this_00 = (((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
              super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_pDevice)->m_LogicalVkDevice).
            super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vkShaderStages.
  super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ShaderModules_00 = &ShaderModules;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ShaderModules.
  super__Vector_base<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  InitInternalObjects<Diligent::RayTracingPipelineStateCreateInfo>
            (&ShaderStages,this,CreateInfo,&vkShaderStages,ShaderModules_00);
  pGVar1 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
           m_pGraphicsPipelineData;
  vkShaderGroups.
  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  vkShaderGroups.
  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  vkShaderGroups.
  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  GetShaderModuleIndex.ShaderStages = &ShaderStages;
  std::
  vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ::reserve(&vkShaderGroups,
            (ulong)CreateInfo->ProceduralHitShaderCount +
            (ulong)CreateInfo->TriangleHitShaderCount + (ulong)CreateInfo->GeneralShaderCount);
  this_01 = &(pGVar1->Desc).BlendDesc.RenderTargets[0].DestBlendAlpha;
  lVar12 = 0;
  for (uVar10 = 0; uVar10 < CreateInfo->GeneralShaderCount; uVar10 = uVar10 + 1) {
    pRVar2 = CreateInfo->pGeneralShaders;
    Group.pNext = (void *)0x0;
    Group.intersectionShader = 0;
    Group._36_4_ = 0;
    Group.pShaderGroupCaptureReplayHandle = (void *)0x0;
    Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_GENERAL_KHR;
    Group.generalShader = 0;
    Group.closestHitShader = 0;
    Group.anyHitShader = 0;
    Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
    Group._4_4_ = 0;
    uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                      (&GetShaderModuleIndex,*(IShader **)((long)&pRVar2->pShader + lVar12));
    Args = (char (*) [28])((long)&pRVar2->Name + lVar12);
    Group.generalShader = uVar5;
    Group.closestHitShader = 0xffffffff;
    Group.anyHitShader = 0xffffffff;
    Group.intersectionShader = 0xffffffff;
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*(Char **)*Args,false);
    cVar7 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this_01,(key_type *)&msg);
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    if (cVar7.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      FormatString<char[28],char_const*,char[130]>
                (&msg,(Diligent *)"Can\'t find general shader \'",Args,
                 (char **)
                 "\'. This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same general shaders."
                 ,(char (*) [130])ShaderModules_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x1c9);
      std::__cxx11::string::~string((string *)&msg);
    }
    uVar8 = ((long)vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)vkShaderGroups.
                  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    if (uVar8 != *(uint *)((long)cVar7.
                                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
                                 ._M_cur + 0x18)) {
      ShaderModules_00 =
           (vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
            *)((long)cVar7.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
                     ._M_cur + 0x18);
      local_138 = uVar8;
      FormatString<char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[140]>
                (&msg,(Diligent *)"General shader group \'",(char (*) [23])Args,
                 (char **)"\' index mismatch: (",(char (*) [20])ShaderModules_00,(uint *)" != ",
                 (char (*) [5])&local_138,
                 (unsigned_long *)
                 "). This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same shaders in the same order."
                 ,(char (*) [140])in_stack_fffffffffffffe98);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x1cd);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::
    vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
    ::push_back(&vkShaderGroups,&Group);
    lVar12 = lVar12 + 0x10;
  }
  lVar12 = 0;
  for (uVar10 = 0; uVar10 < CreateInfo->TriangleHitShaderCount; uVar10 = uVar10 + 1) {
    pRVar3 = CreateInfo->pTriangleHitShaders;
    Group.pNext = (void *)0x0;
    Group.closestHitShader = 0;
    Group.anyHitShader = 0;
    Group.intersectionShader = 0;
    Group._36_4_ = 0;
    Group.pShaderGroupCaptureReplayHandle = (void *)0x0;
    Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
    Group._4_4_ = 0;
    Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_TRIANGLES_HIT_GROUP_KHR;
    Group.generalShader = 0xffffffff;
    uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                      (&GetShaderModuleIndex,
                       *(IShader **)((long)&pRVar3->pClosestHitShader + lVar12));
    Group.closestHitShader = uVar5;
    uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                      (&GetShaderModuleIndex,*(IShader **)((long)&pRVar3->pAnyHitShader + lVar12));
    Args_01 = (char (*) [32])((long)&pRVar3->Name + lVar12);
    Group.anyHitShader = uVar5;
    Group.intersectionShader = 0xffffffff;
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*(Char **)*Args_01,false);
    cVar7 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this_01,(key_type *)&msg);
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    if (cVar7.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      FormatString<char[32],char_const*,char[125]>
                (&msg,(Diligent *)"Can\'t find triangle hit group \'",Args_01,
                 (char **)
                 "\'. This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups."
                 ,(char (*) [125])ShaderModules_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x1e6);
      std::__cxx11::string::~string((string *)&msg);
    }
    uVar8 = ((long)vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)vkShaderGroups.
                  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    if (uVar8 != *(uint *)((long)cVar7.
                                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
                                 ._M_cur + 0x18)) {
      ShaderModules_00 =
           (vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
            *)((long)cVar7.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
                     ._M_cur + 0x18);
      local_138 = uVar8;
      FormatString<char[21],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[143]>
                (&msg,(Diligent *)"Triangle hit group \'",(char (*) [21])Args_01,
                 (char **)"\' index mismatch: (",(char (*) [20])ShaderModules_00,(uint *)" != ",
                 (char (*) [5])&local_138,
                 (unsigned_long *)
                 "). This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups in the same order."
                 ,in_stack_fffffffffffffe98);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x1ea);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::
    vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
    ::push_back(&vkShaderGroups,&Group);
    lVar12 = lVar12 + 0x18;
  }
  lVar12 = 0;
  for (uVar10 = 0; uVar10 < CreateInfo->ProceduralHitShaderCount; uVar10 = uVar10 + 1) {
    pRVar4 = CreateInfo->pProceduralHitShaders;
    Group.pNext = (void *)0x0;
    Group.closestHitShader = 0;
    Group.anyHitShader = 0;
    Group.intersectionShader = 0;
    Group._36_4_ = 0;
    Group.pShaderGroupCaptureReplayHandle = (void *)0x0;
    Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_SHADER_GROUP_CREATE_INFO_KHR;
    Group._4_4_ = 0;
    Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_PROCEDURAL_HIT_GROUP_KHR;
    Group.generalShader = 0xffffffff;
    uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                      (&GetShaderModuleIndex,
                       *(IShader **)((long)&pRVar4->pIntersectionShader + lVar12));
    Group.intersectionShader = uVar5;
    uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                      (&GetShaderModuleIndex,
                       *(IShader **)((long)&pRVar4->pClosestHitShader + lVar12));
    Group.closestHitShader = uVar5;
    uVar5 = anon_unknown_231::BuildRTShaderGroupDescription::anon_class_8_1_b52c7398::operator()
                      (&GetShaderModuleIndex,*(IShader **)((long)&pRVar4->pAnyHitShader + lVar12));
    Args_00 = (char (*) [34])((long)&pRVar4->Name + lVar12);
    Group.anyHitShader = uVar5;
    HashMapStringKey::HashMapStringKey((HashMapStringKey *)&msg,*(Char **)*Args_00,false);
    cVar7 = std::
            _Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<Diligent::HashMapStringKey,_std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_std::allocator<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<Diligent::HashMapStringKey>,_std::hash<Diligent::HashMapStringKey>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)this_01,(key_type *)&msg);
    HashMapStringKey::Clear((HashMapStringKey *)&msg);
    if (cVar7.
        super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>.
        _M_cur == (__node_type *)0x0) {
      FormatString<char[34],char_const*,char[125]>
                (&msg,(Diligent *)"Can\'t find procedural hit group \'",Args_00,
                 (char **)
                 "\'. This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups."
                 ,(char (*) [125])ShaderModules_00);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x203);
      std::__cxx11::string::~string((string *)&msg);
    }
    uVar8 = ((long)vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)vkShaderGroups.
                  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
    if (uVar8 != *(uint *)((long)cVar7.
                                 super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
                                 ._M_cur + 0x18)) {
      ShaderModules_00 =
           (vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
            *)((long)cVar7.
                     super__Node_iterator_base<std::pair<const_Diligent::HashMapStringKey,_unsigned_int>,_false>
                     ._M_cur + 0x18);
      local_138 = uVar8;
      FormatString<char[23],char_const*,char[20],unsigned_int,char[5],unsigned_long,char[143]>
                (&msg,(Diligent *)"Procedural hit group \'",(char (*) [23])Args_00,
                 (char **)"\' index mismatch: (",(char (*) [20])ShaderModules_00,(uint *)" != ",
                 (char (*) [5])&local_138,
                 (unsigned_long *)
                 "). This looks to be a bug as NameToGroupIndex is initialized by CopyRTShaderGroupNames() that processes the same hit groups in the same order."
                 ,in_stack_fffffffffffffe98);
      DebugAssertionFailed
                (msg._M_dataplus._M_p,"BuildRTShaderGroupDescription",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
                 ,0x207);
      std::__cxx11::string::~string((string *)&msg);
    }
    std::
    vector<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
    ::push_back(&vkShaderGroups,&Group);
    lVar12 = lVar12 + 0x20;
  }
  pSrcPtr = (CreateInfo->super_PipelineStateCreateInfo).pPSOCache;
  if (pSrcPtr == (IPipelineStateCache *)0x0) {
    cache = (VkPipelineCache)0x0;
  }
  else {
    CheckDynamicType<Diligent::PipelineStateCacheVkImpl,Diligent::IPipelineStateCache>(pSrcPtr);
    cache = (VkPipelineCache)pSrcPtr[9].super_IDeviceObject.super_IObject._vptr_IObject;
  }
  Group.pNext = (void *)0x0;
  Group.sType = VK_STRUCTURE_TYPE_RAY_TRACING_PIPELINE_CREATE_INFO_KHR;
  Group._4_4_ = 0;
  Group.generalShader =
       (uint32_t)
       (((long)vkShaderStages.
               super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               ._M_impl.super__Vector_impl_data._M_finish -
        (long)vkShaderStages.
              super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
              ._M_impl.super__Vector_impl_data._M_start) / 0x30);
  Group.type = VK_RAY_TRACING_SHADER_GROUP_TYPE_TRIANGLES_HIT_GROUP_KHR;
  Group._24_8_ = vkShaderStages.
                 super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  Group._32_8_ = ((long)vkShaderGroups.
                        super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                 (long)vkShaderGroups.
                       super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                       ._M_impl.super__Vector_impl_data._M_start) / 0x30 & 0xffffffff;
  Group.pShaderGroupCaptureReplayHandle =
       vkShaderGroups.
       super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
       ._M_impl.super__Vector_impl_data._M_start;
  VulkanUtilities::VulkanLogicalDevice::CreateRayTracingPipeline
            ((PipelineWrapper *)&msg,
             (((this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
               super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
              .m_pDevice)->m_LogicalVkDevice).
             super___shared_ptr<VulkanUtilities::VulkanLogicalDevice,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr,(VkRayTracingPipelineCreateInfoKHR *)&Group,cache,
             (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).
             super_DeviceObjectBase<Diligent::IPipelineStateVk,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineStateDesc>
             .m_Desc.super_DeviceObjectAttribs.Name);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  operator=(&this->m_Pipeline,
            (VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9> *)&msg);
  VulkanUtilities::VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9>::
  ~VulkanObjectWrapper
            ((VulkanObjectWrapper<VkPipeline_T_*,_(VulkanUtilities::VulkanHandleTypeId)9> *)&msg);
  pRVar11 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
            m_pRayTracingPipelineData;
  sVar9 = ((long)vkShaderGroups.
                 super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
          (long)vkShaderGroups.
                super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  if ((pRVar11->NameToGroupIndex)._M_h._M_element_count != sVar9) {
    FormatString<char[108]>
              ((string *)&Group,
               (char (*) [108])
               "The size of NameToGroupIndex map does not match the actual number of groups in the pipeline. This is a bug."
              );
    DebugAssertionFailed
              ((Char *)Group._0_8_,"InitializePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x37c);
    std::__cxx11::string::~string((string *)&Group);
    pRVar11 = (this->super_PipelineStateBase<Diligent::EngineVkImplTraits>).field_6.
              m_pRayTracingPipelineData;
    sVar9 = ((long)vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
            (long)vkShaderGroups.
                  super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                  ._M_impl.super__Vector_impl_data._M_start) / 0x30;
  }
  VVar6 = VulkanUtilities::VulkanLogicalDevice::GetRayTracingShaderGroupHandles
                    (this_00,(this->m_Pipeline).m_VkObject,0,(uint32_t)sVar9,
                     (ulong)pRVar11->ShaderDataSize,pRVar11->ShaderHandles);
  if (VVar6 != VK_SUCCESS) {
    FormatString<char[35]>((string *)&Group,(char (*) [35])"Failed to get shader group handles");
    DebugAssertionFailed
              ((Char *)Group._0_8_,"InitializePipeline",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/PipelineStateVkImpl.cpp"
               ,0x37f);
    std::__cxx11::string::~string((string *)&Group);
  }
  std::
  _Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
  ::~_Vector_base(&vkShaderGroups.
                   super__Vector_base<VkRayTracingShaderGroupCreateInfoKHR,_std::allocator<VkRayTracingShaderGroupCreateInfoKHR>_>
                 );
  std::
  vector<Diligent::PipelineStateVkImpl::ShaderStageInfo,_std::allocator<Diligent::PipelineStateVkImpl::ShaderStageInfo>_>
  ::~vector(&ShaderStages);
  std::
  vector<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>,_std::allocator<VulkanUtilities::VulkanObjectWrapper<VkShaderModule_T_*,_(VulkanUtilities::VulkanHandleTypeId)10>_>_>
  ::~vector(&ShaderModules);
  std::
  _Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>::
  ~_Vector_base(&vkShaderStages.
                 super__Vector_base<VkPipelineShaderStageCreateInfo,_std::allocator<VkPipelineShaderStageCreateInfo>_>
               );
  return;
}

Assistant:

void PipelineStateVkImpl::InitializePipeline(const RayTracingPipelineStateCreateInfo& CreateInfo)
{
    const VulkanUtilities::VulkanLogicalDevice& LogicalDevice = m_pDevice->GetLogicalDevice();

    std::vector<VkPipelineShaderStageCreateInfo>      vkShaderStages;
    std::vector<VulkanUtilities::ShaderModuleWrapper> ShaderModules;

    const PipelineStateVkImpl::TShaderStages                ShaderStages   = InitInternalObjects(CreateInfo, vkShaderStages, ShaderModules);
    const std::vector<VkRayTracingShaderGroupCreateInfoKHR> vkShaderGroups = BuildRTShaderGroupDescription(CreateInfo, m_pRayTracingPipelineData->NameToGroupIndex, ShaderStages);
    const VkPipelineCache                                   vkSPOCache     = CreateInfo.pPSOCache != nullptr ? ClassPtrCast<PipelineStateCacheVkImpl>(CreateInfo.pPSOCache)->GetVkPipelineCache() : VK_NULL_HANDLE;

    CreateRayTracingPipeline(m_pDevice, vkShaderStages, vkShaderGroups, m_PipelineLayout, m_Desc, m_pRayTracingPipelineData->Desc, m_Pipeline, vkSPOCache);

    VERIFY(m_pRayTracingPipelineData->NameToGroupIndex.size() == vkShaderGroups.size(),
           "The size of NameToGroupIndex map does not match the actual number of groups in the pipeline. This is a bug.");
    // Get shader group handles from the PSO.
    VkResult err = LogicalDevice.GetRayTracingShaderGroupHandles(m_Pipeline, 0, static_cast<uint32_t>(vkShaderGroups.size()), m_pRayTracingPipelineData->ShaderDataSize, m_pRayTracingPipelineData->ShaderHandles);
    DEV_CHECK_ERR(err == VK_SUCCESS, "Failed to get shader group handles");
    (void)err;
}